

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample.cpp
# Opt level: O2

int __thiscall
ncnn::GridSample::forward
          (GridSample *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  uint uVar2;
  uint _c;
  uint uVar3;
  uint _d;
  pointer pMVar4;
  Mat *this_00;
  void *pvVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int align_corner;
  int align_corner_00;
  int align_corner_01;
  int align_corner_02;
  int align_corner_03;
  int align_corner_04;
  int align_corner_05;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar12;
  ulong extraout_RDX_01;
  ulong uVar13;
  ulong extraout_RDX_02;
  int iVar14;
  float *pfVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  float *pfVar23;
  int z;
  int iVar24;
  bool bVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  int local_288;
  Mat m;
  float *local_208;
  float *local_1d8;
  float *local_1c8;
  float x_coeffs [4];
  float y_coeffs [4];
  
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar1 = pMVar4->w;
  uVar2 = pMVar4->h;
  _c = pMVar4->c;
  local_288 = -100;
  if (pMVar4->dims == 4) {
    uVar3 = pMVar4->d;
    iVar17 = pMVar4[1].h;
    iVar24 = pMVar4[1].d;
    _d = pMVar4[1].c;
    Mat::create(this_00,iVar17,iVar24,_d,_c,pMVar4->elemsize,opt->blob_allocator);
    if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
      iVar8 = this->sample_type;
      if (iVar8 == 1) {
        if (iVar17 < 1) {
          iVar17 = 0;
        }
        if (iVar24 < 1) {
          iVar24 = 0;
        }
        if ((int)_d < 1) {
          _d = 0;
        }
        local_288 = 0;
        if ((int)_c < 1) {
          _c = 0;
        }
        for (uVar9 = 0; uVar9 != _c; uVar9 = uVar9 + 1) {
          m.w = pMVar4->w;
          m.h = pMVar4->h;
          m.elemsize = pMVar4->elemsize;
          m.data = (void *)(pMVar4->cstep * uVar9 * m.elemsize + (long)pMVar4->data);
          m.c = pMVar4->d;
          m.elempack = pMVar4->elempack;
          m.allocator = pMVar4->allocator;
          m.refcount = (int *)0x0;
          m.d = 1;
          m.dims = pMVar4->dims + -1;
          m.cstep = (m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / m.elemsize;
          if (pMVar4->dims == 4) {
            m.cstep = (long)m.h * (long)m.w;
          }
          local_1c8 = (float *)(this_00->cstep * uVar9 * this_00->elemsize + (long)this_00->data);
          for (uVar10 = 0; uVar10 != _d; uVar10 = uVar10 + 1) {
            pfVar23 = (float *)(pMVar4[1].cstep * uVar10 * pMVar4[1].elemsize + (long)pMVar4[1].data
                               );
            for (iVar8 = 0; iVar8 != iVar24; iVar8 = iVar8 + 1) {
              iVar14 = this->padding_mode;
              iVar22 = this->align_corner;
              iVar18 = iVar17;
              while (bVar25 = iVar18 != 0, iVar18 = iVar18 + -1, bVar25) {
                fVar27 = pfVar23[1];
                fVar26 = pfVar23[2];
                fVar28 = grid_sample_unormalize((ncnn *)(ulong)uVar1,iVar22,*pfVar23,(int)pfVar23);
                fVar27 = grid_sample_unormalize((ncnn *)(ulong)uVar2,iVar22,fVar27,align_corner_00);
                fVar26 = grid_sample_unormalize((ncnn *)(ulong)uVar3,iVar22,fVar26,align_corner_01);
                fVar29 = floorf(fVar28);
                iVar16 = (int)fVar29;
                fVar30 = floorf(fVar27);
                iVar21 = (int)fVar30;
                fVar31 = floorf(fVar26);
                z = (int)fVar31;
                iVar19 = iVar16 + 1;
                iVar6 = iVar21 + 1;
                iVar7 = z + 1;
                fVar32 = get_value_bounded(&m,iVar16,iVar21,z,iVar14,iVar22);
                fVar33 = get_value_bounded(&m,iVar19,iVar21,z,iVar14,iVar22);
                fVar34 = get_value_bounded(&m,iVar16,iVar6,z,iVar14,iVar22);
                fVar35 = get_value_bounded(&m,iVar19,iVar6,z,iVar14,iVar22);
                fVar36 = get_value_bounded(&m,iVar16,iVar21,iVar7,iVar14,iVar22);
                fVar37 = get_value_bounded(&m,iVar19,iVar21,iVar7,iVar14,iVar22);
                fVar38 = get_value_bounded(&m,iVar16,iVar6,iVar7,iVar14,iVar22);
                fVar39 = get_value_bounded(&m,iVar19,iVar6,iVar7,iVar14,iVar22);
                fVar28 = fVar28 - (float)(int)fVar29;
                fVar27 = fVar27 - (float)(int)fVar30;
                fVar29 = 1.0 - fVar28;
                fVar30 = fVar27 * (fVar35 * fVar28 + fVar34 * fVar29) +
                         (1.0 - fVar27) * (fVar32 * fVar29 + fVar33 * fVar28);
                *local_1c8 = (((1.0 - fVar27) * (fVar36 * fVar29 + fVar37 * fVar28) - fVar30) +
                             fVar27 * (fVar39 * fVar28 + fVar38 * fVar29)) *
                             (fVar26 - (float)(int)fVar31) + fVar30;
                local_1c8 = local_1c8 + 1;
                pfVar23 = pfVar23 + 3;
              }
            }
          }
        }
      }
      else if (iVar8 == 2) {
        if (iVar17 < 1) {
          iVar17 = 0;
        }
        if (iVar24 < 1) {
          iVar24 = 0;
        }
        if ((int)_d < 1) {
          _d = 0;
        }
        local_288 = 0;
        if ((int)_c < 1) {
          _c = 0;
        }
        for (uVar9 = 0; uVar9 != _c; uVar9 = uVar9 + 1) {
          m.w = pMVar4->w;
          m.h = pMVar4->h;
          m.elemsize = pMVar4->elemsize;
          m.data = (void *)(pMVar4->cstep * uVar9 * m.elemsize + (long)pMVar4->data);
          m.c = pMVar4->d;
          m.elempack = pMVar4->elempack;
          m.allocator = pMVar4->allocator;
          m.refcount = (int *)0x0;
          m.d = 1;
          m.dims = pMVar4->dims - 1;
          uVar10 = (ulong)(uint)m.dims;
          m.cstep = (m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / m.elemsize;
          if (pMVar4->dims == 4) {
            m.cstep = (long)m.h * (long)m.w;
          }
          pfVar23 = (float *)(this_00->cstep * uVar9 * this_00->elemsize + (long)this_00->data);
          for (uVar13 = 0; uVar13 != _d; uVar13 = uVar13 + 1) {
            pfVar15 = (float *)(pMVar4[1].cstep * uVar13 * pMVar4[1].elemsize + (long)pMVar4[1].data
                               );
            for (iVar8 = 0; iVar8 != iVar24; iVar8 = iVar8 + 1) {
              iVar14 = this->padding_mode;
              iVar22 = this->align_corner;
              iVar18 = iVar17;
              while (bVar25 = iVar18 != 0, iVar18 = iVar18 + -1, bVar25) {
                fVar27 = pfVar15[1];
                fVar26 = pfVar15[2];
                fVar28 = grid_sample_unormalize((ncnn *)(ulong)uVar1,iVar22,*pfVar15,(int)uVar10);
                fVar27 = grid_sample_unormalize((ncnn *)(ulong)uVar2,iVar22,fVar27,align_corner_02);
                fVar26 = grid_sample_unormalize((ncnn *)(ulong)uVar3,iVar22,fVar26,align_corner_03);
                fVar28 = roundf(fVar28);
                fVar27 = roundf(fVar27);
                fVar26 = roundf(fVar26);
                fVar27 = get_value_bounded(&m,(int)fVar28,(int)fVar27,(int)fVar26,iVar14,iVar22);
                *pfVar23 = fVar27;
                pfVar23 = pfVar23 + 1;
                pfVar15 = pfVar15 + 3;
                uVar10 = extraout_RDX_00;
              }
            }
          }
        }
      }
      else {
        local_288 = 0;
        if (iVar8 == 3) {
          fwrite("unsupported bicubic when dims == 4",0x22,1,_stderr);
          fputc(10,_stderr);
          local_288 = -1;
        }
      }
    }
  }
  else if (pMVar4->dims == 3) {
    iVar17 = pMVar4[1].h;
    uVar3 = pMVar4[1].c;
    Mat::create(this_00,iVar17,uVar3,_c,pMVar4->elemsize,opt->blob_allocator);
    if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
      iVar24 = this->sample_type;
      if (iVar24 == 1) {
        if (iVar17 < 1) {
          iVar17 = 0;
        }
        uVar9 = (ulong)uVar3;
        if ((int)uVar3 < 1) {
          uVar9 = 0;
        }
        local_288 = 0;
        if ((int)_c < 1) {
          _c = 0;
        }
        for (uVar10 = 0; uVar10 != _c; uVar10 = uVar10 + 1) {
          m.w = pMVar4->w;
          m.h = pMVar4->h;
          m.elemsize = pMVar4->elemsize;
          m.data = (void *)(pMVar4->cstep * uVar10 * m.elemsize + (long)pMVar4->data);
          m.c = pMVar4->d;
          m.elempack = pMVar4->elempack;
          m.allocator = pMVar4->allocator;
          m.refcount = (int *)0x0;
          m.d = 1;
          m.dims = pMVar4->dims + -1;
          m.cstep = (m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / m.elemsize;
          if (pMVar4->dims == 4) {
            m.cstep = (long)m.h * (long)m.w;
          }
          local_208 = (float *)(this_00->cstep * uVar10 * this_00->elemsize + (long)this_00->data);
          for (uVar13 = 0; uVar13 != uVar9; uVar13 = uVar13 + 1) {
            iVar24 = this->padding_mode;
            iVar8 = this->align_corner;
            lVar20 = pMVar4[1].cstep * pMVar4[1].elemsize * uVar13;
            pvVar5 = pMVar4[1].data;
            uVar12 = uVar13;
            for (lVar11 = 0; iVar17 != (int)lVar11; lVar11 = lVar11 + 1) {
              fVar27 = *(float *)((long)pvVar5 + lVar11 * 8 + lVar20 + 4);
              fVar26 = grid_sample_unormalize
                                 ((ncnn *)(ulong)uVar1,iVar8,
                                  *(float *)((long)pvVar5 + lVar11 * 8 + lVar20),(int)uVar12);
              fVar27 = grid_sample_unormalize((ncnn *)(ulong)uVar2,iVar8,fVar27,align_corner_05);
              fVar28 = floorf(fVar26);
              iVar22 = (int)fVar28;
              fVar29 = floorf(fVar27);
              iVar14 = (int)fVar29;
              fVar30 = get_value_bounded(&m,iVar22,iVar14,iVar24,iVar8);
              fVar31 = get_value_bounded(&m,iVar22 + 1,iVar14,iVar24,iVar8);
              fVar32 = get_value_bounded(&m,iVar22,iVar14 + 1,iVar24,iVar8);
              fVar33 = get_value_bounded(&m,iVar22 + 1,iVar14 + 1,iVar24,iVar8);
              fVar26 = fVar26 - (float)(int)fVar28;
              fVar28 = fVar30 * (1.0 - fVar26) + fVar31 * fVar26;
              *local_208 = ((fVar33 * fVar26 + fVar32 * (1.0 - fVar26)) - fVar28) *
                           (fVar27 - (float)(int)fVar29) + fVar28;
              local_208 = local_208 + 1;
              uVar12 = extraout_RDX_02;
            }
          }
        }
      }
      else if (iVar24 == 2) {
        if (iVar17 < 1) {
          iVar17 = 0;
        }
        uVar9 = (ulong)uVar3;
        if ((int)uVar3 < 1) {
          uVar9 = 0;
        }
        local_288 = 0;
        if ((int)_c < 1) {
          _c = 0;
        }
        for (uVar10 = 0; uVar10 != _c; uVar10 = uVar10 + 1) {
          m.w = pMVar4->w;
          m.h = pMVar4->h;
          m.elemsize = pMVar4->elemsize;
          m.data = (void *)(pMVar4->cstep * uVar10 * m.elemsize + (long)pMVar4->data);
          m.c = pMVar4->d;
          m.elempack = pMVar4->elempack;
          m.allocator = pMVar4->allocator;
          m.refcount = (int *)0x0;
          m.d = 1;
          m.dims = pMVar4->dims + -1;
          m.cstep = (m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / m.elemsize;
          if (pMVar4->dims == 4) {
            m.cstep = (long)m.h * (long)m.w;
          }
          pfVar23 = (float *)(this_00->cstep * uVar10 * this_00->elemsize + (long)this_00->data);
          for (uVar13 = 0; uVar13 != uVar9; uVar13 = uVar13 + 1) {
            iVar24 = this->padding_mode;
            iVar8 = this->align_corner;
            lVar20 = pMVar4[1].cstep * pMVar4[1].elemsize * uVar13;
            pvVar5 = pMVar4[1].data;
            uVar12 = uVar13;
            for (lVar11 = 0; iVar17 != (int)lVar11; lVar11 = lVar11 + 1) {
              fVar27 = *(float *)((long)pvVar5 + lVar11 * 8 + lVar20 + 4);
              fVar26 = grid_sample_unormalize
                                 ((ncnn *)(ulong)uVar1,iVar8,
                                  *(float *)((long)pvVar5 + lVar11 * 8 + lVar20),(int)uVar12);
              fVar27 = grid_sample_unormalize((ncnn *)(ulong)uVar2,iVar8,fVar27,align_corner_04);
              fVar26 = roundf(fVar26);
              fVar27 = roundf(fVar27);
              fVar27 = get_value_bounded(&m,(int)fVar26,(int)fVar27,iVar24,iVar8);
              *pfVar23 = fVar27;
              pfVar23 = pfVar23 + 1;
              uVar12 = extraout_RDX_01;
            }
          }
        }
      }
      else {
        local_288 = 0;
        if (iVar24 == 3) {
          if (iVar17 < 1) {
            iVar17 = 0;
          }
          if ((int)uVar3 < 1) {
            uVar3 = 0;
          }
          local_288 = 0;
          if ((int)_c < 1) {
            _c = 0;
          }
          for (uVar9 = 0; uVar9 != _c; uVar9 = uVar9 + 1) {
            m.w = pMVar4->w;
            m.h = pMVar4->h;
            m.elemsize = pMVar4->elemsize;
            m.data = (void *)(pMVar4->cstep * uVar9 * m.elemsize + (long)pMVar4->data);
            m.c = pMVar4->d;
            m.elempack = pMVar4->elempack;
            m.allocator = pMVar4->allocator;
            m.refcount = (int *)0x0;
            m.d = 1;
            m.dims = pMVar4->dims + -1;
            m.cstep = (m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / m.elemsize;
            if (pMVar4->dims == 4) {
              m.cstep = (long)m.h * (long)m.w;
            }
            local_1d8 = (float *)(this_00->cstep * uVar9 * this_00->elemsize + (long)this_00->data);
            for (uVar10 = 0; uVar10 != uVar3; uVar10 = uVar10 + 1) {
              iVar24 = this->padding_mode;
              iVar8 = this->align_corner;
              lVar20 = pMVar4[1].cstep * pMVar4[1].elemsize * uVar10;
              pvVar5 = pMVar4[1].data;
              uVar13 = uVar10;
              for (lVar11 = 0; iVar17 != (int)lVar11; lVar11 = lVar11 + 1) {
                fVar27 = *(float *)((long)pvVar5 + lVar11 * 8 + lVar20 + 4);
                fVar26 = grid_sample_unormalize
                                   ((ncnn *)(ulong)uVar1,iVar8,
                                    *(float *)((long)pvVar5 + lVar11 * 8 + lVar20),(int)uVar13);
                fVar27 = grid_sample_unormalize((ncnn *)(ulong)uVar2,iVar8,fVar27,align_corner);
                fVar28 = floorf(fVar26);
                iVar21 = (int)fVar28;
                fVar29 = floorf(fVar27);
                iVar16 = (int)fVar29;
                iVar19 = iVar21 + -1;
                iVar14 = iVar16 + -1;
                iVar6 = iVar21 + 1;
                iVar22 = iVar16 + 1;
                iVar7 = iVar21 + 2;
                iVar18 = iVar16 + 2;
                fVar30 = get_value_bounded(&m,iVar19,iVar14,iVar24,iVar8);
                fVar31 = get_value_bounded(&m,iVar21,iVar14,iVar24,iVar8);
                fVar32 = get_value_bounded(&m,iVar6,iVar14,iVar24,iVar8);
                fVar33 = get_value_bounded(&m,iVar7,iVar14,iVar24,iVar8);
                fVar34 = get_value_bounded(&m,iVar19,iVar16,iVar24,iVar8);
                fVar35 = get_value_bounded(&m,iVar21,iVar16,iVar24,iVar8);
                fVar36 = get_value_bounded(&m,iVar6,iVar16,iVar24,iVar8);
                fVar37 = get_value_bounded(&m,iVar7,iVar16,iVar24,iVar8);
                fVar38 = get_value_bounded(&m,iVar19,iVar22,iVar24,iVar8);
                fVar39 = get_value_bounded(&m,iVar21,iVar22,iVar24,iVar8);
                fVar40 = get_value_bounded(&m,iVar6,iVar22,iVar24,iVar8);
                fVar41 = get_value_bounded(&m,iVar7,iVar22,iVar24,iVar8);
                fVar42 = get_value_bounded(&m,iVar19,iVar18,iVar24,iVar8);
                fVar43 = get_value_bounded(&m,iVar21,iVar18,iVar24,iVar8);
                fVar44 = get_value_bounded(&m,iVar6,iVar18,iVar24,iVar8);
                fVar45 = get_value_bounded(&m,iVar7,iVar18,iVar24,iVar8);
                interpolate_cubic(fVar26 - (float)(int)fVar28,x_coeffs);
                interpolate_cubic(fVar27 - (float)(int)fVar29,y_coeffs);
                fVar27 = (float)x_coeffs._0_8_;
                fVar26 = SUB84(x_coeffs._0_8_,4);
                *local_1d8 = (fVar45 * x_coeffs[3] + fVar44 * x_coeffs[2] +
                             fVar43 * fVar26 + fVar42 * fVar27) * y_coeffs[3] +
                             (fVar37 * x_coeffs[3] + fVar36 * x_coeffs[2] +
                             fVar35 * fVar26 + fVar34 * fVar27) * y_coeffs[1] +
                             (fVar41 * x_coeffs[3] + fVar40 * x_coeffs[2] +
                             fVar38 * fVar27 + fVar39 * fVar26) * y_coeffs[2] +
                             (fVar33 * x_coeffs[3] + fVar32 * x_coeffs[2] +
                             fVar30 * fVar27 + fVar31 * fVar26) * y_coeffs[0];
                local_1d8 = local_1d8 + 1;
                uVar13 = extraout_RDX;
              }
            }
          }
        }
      }
    }
  }
  else {
    local_288 = 0;
  }
  return local_288;
}

Assistant:

int GridSample::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& grid = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    if (dims == 3)
    {
        int outw = grid.h;
        int outh = grid.c;

        top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (sample_type == 1) // bilinear
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat image = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int y = 0; y < outh; y++)
                {
                    const float* gridptr = grid.channel(y);

                    for (int x = 0; x < outw; x++)
                    {
                        float sample_x = gridptr[0];
                        float sample_y = gridptr[1];

                        sample_x = grid_sample_unormalize(w, sample_x, align_corner);
                        sample_y = grid_sample_unormalize(h, sample_y, align_corner);

                        // bilinear interpolate
                        float v;
                        {
                            int x0 = (int)floor(sample_x);
                            int y0 = (int)floor(sample_y);
                            int x1 = x0 + 1;
                            int y1 = y0 + 1;

                            float v00 = get_value_bounded(image, x0, y0, padding_mode, align_corner);
                            float v01 = get_value_bounded(image, x1, y0, padding_mode, align_corner);
                            float v10 = get_value_bounded(image, x0, y1, padding_mode, align_corner);
                            float v11 = get_value_bounded(image, x1, y1, padding_mode, align_corner);

                            float alpha = sample_x - x0;
                            float beta = sample_y - y0;

                            float v0 = v00 * (1 - alpha) + v01 * alpha;
                            float v1 = v10 * (1 - alpha) + v11 * alpha;

                            v = v0 * (1 - beta) + v1 * beta;
                        }

                        outptr[0] = v;
                        outptr += 1;

                        gridptr += 2;
                    }
                }
            }
        }
        else if (sample_type == 2) // nearest
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat image = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int y = 0; y < outh; y++)
                {
                    const float* gridptr = grid.channel(y);

                    for (int x = 0; x < outw; x++)
                    {
                        float sample_x = gridptr[0];
                        float sample_y = gridptr[1];

                        sample_x = grid_sample_unormalize(w, sample_x, align_corner);
                        sample_y = grid_sample_unormalize(h, sample_y, align_corner);

                        int x0 = static_cast<int>(round(sample_x));
                        int y0 = static_cast<int>(round(sample_y));

                        float v = get_value_bounded(image, x0, y0, padding_mode, align_corner);

                        outptr[0] = v;
                        outptr += 1;

                        gridptr += 2;
                    }
                }
            }
        }
        else if (sample_type == 3) // bicubic
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat image = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int y = 0; y < outh; y++)
                {
                    const float* gridptr = grid.channel(y);

                    for (int x = 0; x < outw; x++)
                    {
                        float sample_x = gridptr[0];
                        float sample_y = gridptr[1];

                        sample_x = grid_sample_unormalize(w, sample_x, align_corner);
                        sample_y = grid_sample_unormalize(h, sample_y, align_corner);

                        // bicubic interpolate
                        float v;
                        {
                            int x1 = (int)floorf(sample_x);
                            int y1 = (int)floorf(sample_y);
                            int x0 = x1 - 1;
                            int y0 = y1 - 1;
                            int x2 = x1 + 1;
                            int y2 = y1 + 1;
                            int x3 = x1 + 2;
                            int y3 = y1 + 2;

                            float v00 = get_value_bounded(image, x0, y0, padding_mode, align_corner);
                            float v01 = get_value_bounded(image, x1, y0, padding_mode, align_corner);
                            float v02 = get_value_bounded(image, x2, y0, padding_mode, align_corner);
                            float v03 = get_value_bounded(image, x3, y0, padding_mode, align_corner);
                            float v10 = get_value_bounded(image, x0, y1, padding_mode, align_corner);
                            float v11 = get_value_bounded(image, x1, y1, padding_mode, align_corner);
                            float v12 = get_value_bounded(image, x2, y1, padding_mode, align_corner);
                            float v13 = get_value_bounded(image, x3, y1, padding_mode, align_corner);
                            float v20 = get_value_bounded(image, x0, y2, padding_mode, align_corner);
                            float v21 = get_value_bounded(image, x1, y2, padding_mode, align_corner);
                            float v22 = get_value_bounded(image, x2, y2, padding_mode, align_corner);
                            float v23 = get_value_bounded(image, x3, y2, padding_mode, align_corner);
                            float v30 = get_value_bounded(image, x0, y3, padding_mode, align_corner);
                            float v31 = get_value_bounded(image, x1, y3, padding_mode, align_corner);
                            float v32 = get_value_bounded(image, x2, y3, padding_mode, align_corner);
                            float v33 = get_value_bounded(image, x3, y3, padding_mode, align_corner);

                            float x_coeffs[4];
                            float y_coeffs[4];
                            interpolate_cubic(sample_x - x1, x_coeffs);
                            interpolate_cubic(sample_y - y1, y_coeffs);

                            float v0 = v00 * x_coeffs[0] + v01 * x_coeffs[1] + v02 * x_coeffs[2] + v03 * x_coeffs[3];
                            float v1 = v10 * x_coeffs[0] + v11 * x_coeffs[1] + v12 * x_coeffs[2] + v13 * x_coeffs[3];
                            float v2 = v20 * x_coeffs[0] + v21 * x_coeffs[1] + v22 * x_coeffs[2] + v23 * x_coeffs[3];
                            float v3 = v30 * x_coeffs[0] + v31 * x_coeffs[1] + v32 * x_coeffs[2] + v33 * x_coeffs[3];

                            v = v0 * y_coeffs[0] + v1 * y_coeffs[1] + v2 * y_coeffs[2] + v3 * y_coeffs[3];
                        }

                        outptr[0] = v;
                        outptr += 1;

                        gridptr += 2;
                    }
                }
            }
        }
    }

    if (dims == 4)
    {
        int outw = grid.h;
        int outh = grid.d;
        int outd = grid.c;

        top_blob.create(outw, outh, outd, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (sample_type == 1) // bilinear
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat image = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < outd; z++)
                {
                    const float* gridptr = grid.channel(z);

                    for (int y = 0; y < outh; y++)
                    {
                        for (int x = 0; x < outw; x++)
                        {
                            float sample_x = gridptr[0];
                            float sample_y = gridptr[1];
                            float sample_z = gridptr[2];

                            sample_x = grid_sample_unormalize(w, sample_x, align_corner);
                            sample_y = grid_sample_unormalize(h, sample_y, align_corner);
                            sample_z = grid_sample_unormalize(d, sample_z, align_corner);

                            // bilinear interpolate
                            float v;
                            {
                                int x0 = (int)floor(sample_x);
                                int y0 = (int)floor(sample_y);
                                int z0 = (int)floor(sample_z);
                                int x1 = x0 + 1;
                                int y1 = y0 + 1;
                                int z1 = z0 + 1;

                                float v000 = get_value_bounded(image, x0, y0, z0, padding_mode, align_corner);
                                float v001 = get_value_bounded(image, x1, y0, z0, padding_mode, align_corner);
                                float v010 = get_value_bounded(image, x0, y1, z0, padding_mode, align_corner);
                                float v011 = get_value_bounded(image, x1, y1, z0, padding_mode, align_corner);
                                float v100 = get_value_bounded(image, x0, y0, z1, padding_mode, align_corner);
                                float v101 = get_value_bounded(image, x1, y0, z1, padding_mode, align_corner);
                                float v110 = get_value_bounded(image, x0, y1, z1, padding_mode, align_corner);
                                float v111 = get_value_bounded(image, x1, y1, z1, padding_mode, align_corner);

                                float alpha = sample_x - x0;
                                float beta = sample_y - y0;
                                float gamma = sample_z - z0;

                                float v00 = v000 * (1 - alpha) + v001 * alpha;
                                float v01 = v010 * (1 - alpha) + v011 * alpha;
                                float v10 = v100 * (1 - alpha) + v101 * alpha;
                                float v11 = v110 * (1 - alpha) + v111 * alpha;

                                float v0 = v00 * (1 - beta) + v01 * beta;
                                float v1 = v10 * (1 - beta) + v11 * beta;

                                v = v0 * (1 - gamma) + v1 * gamma;
                            }

                            outptr[0] = v;
                            outptr += 1;

                            gridptr += 3;
                        }
                    }
                }
            }
        }
        else if (sample_type == 2) // nearest
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat image = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < outd; z++)
                {
                    const float* gridptr = grid.channel(z);

                    for (int y = 0; y < outh; y++)
                    {
                        for (int x = 0; x < outw; x++)
                        {
                            float sample_x = gridptr[0];
                            float sample_y = gridptr[1];
                            float sample_z = gridptr[2];

                            sample_x = grid_sample_unormalize(w, sample_x, align_corner);
                            sample_y = grid_sample_unormalize(h, sample_y, align_corner);
                            sample_z = grid_sample_unormalize(d, sample_z, align_corner);

                            int x0 = static_cast<int>(round(sample_x));
                            int y0 = static_cast<int>(round(sample_y));
                            int z0 = static_cast<int>(round(sample_z));

                            float v = get_value_bounded(image, x0, y0, z0, padding_mode, align_corner);

                            outptr[0] = v;
                            outptr += 1;

                            gridptr += 3;
                        }
                    }
                }
            }
        }
        else if (sample_type == 3)
        {
            NCNN_LOGE("unsupported bicubic when dims == 4");
            return -1;
        }
    }

    return 0;
}